

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardHeader::paintEvent(QWizardHeader *this,QPaintEvent *param_2)

{
  QPalette *this_00;
  long in_FS_OFFSET;
  QPalette *pal;
  int y;
  int x;
  QStylePainter painter;
  QWidget *this_01;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int x2;
  QStylePainter *this_02;
  QPainter *in_stack_ffffffffffffffb8;
  undefined1 *local_28;
  QWidget *pQStack_20;
  QStyle *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QStylePainter *)&local_28;
  QStylePainter::QStylePainter
            (this_02,(QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  x2 = 0;
  QPainter::drawPixmap
            (in_stack_ffffffffffffffb8,(int)((ulong)this_02 >> 0x20),(int)this_02,
             (QPixmap *)(ulong)in_stack_ffffffffffffffa8);
  QWidget::width((QWidget *)0x7b433b);
  QWidget::height((QWidget *)0x7b434b);
  this_00 = QWidget::palette(this_01);
  QPalette::mid((QPalette *)0x7b4376);
  QBrush::color((QBrush *)0x7b437e);
  QPainter::setPen((QColor *)this_02);
  QPainter::drawLine((QPainter *)this_00,(int)((ulong)this_02 >> 0x20),(int)this_02,x2,
                     in_stack_ffffffffffffffa8);
  QPalette::base((QPalette *)0x7b43af);
  QBrush::color((QBrush *)0x7b43b7);
  QPainter::setPen((QColor *)this_02);
  QPainter::drawPoint(&this_02->super_QPainter,x2,in_stack_ffffffffffffffa8);
  QPainter::drawLine((QPainter *)this_00,(int)((ulong)this_02 >> 0x20),(int)this_02,x2,
                     in_stack_ffffffffffffffa8);
  QStylePainter::~QStylePainter((QStylePainter *)0x7b4401);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardHeader::paintEvent(QPaintEvent * /* event */)
{
    QStylePainter painter(this);
    painter.drawPixmap(0, 0, bannerPixmap);

    int x = width() - 2;
    int y = height() - 2;
    const QPalette &pal = palette();
    painter.setPen(pal.mid().color());
    painter.drawLine(0, y, x, y);
    painter.setPen(pal.base().color());
    painter.drawPoint(x + 1, y);
    painter.drawLine(0, y + 1, x + 1, y + 1);
}